

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::reverse(SVInt *this)

{
  byte bVar1;
  undefined1 uVar2;
  ulong uVar3;
  uint uVar4;
  unsigned_long *__old_val;
  void *pvVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong *in_RSI;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  SVInt SVar11;
  SVInt result;
  void *local_48;
  uint local_40;
  undefined1 local_3c;
  byte local_3b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  
  local_40 = (uint)in_RSI[1];
  bVar1 = *(byte *)((long)in_RSI + 0xd);
  if (local_40 < 0x41 && (bVar1 & 1) == 0) {
    uVar6 = *in_RSI;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    uVar6 = (uVar6 & 0xf0f0f0f0f0f0f0f) << 4 | uVar6 >> 4 & 0xf0f0f0f0f0f0f0f;
    uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333) * 4;
    SVInt(this,local_40,
          (uVar6 >> 1 & 0x5555555555555555) + (uVar6 & 0x5555555555555555) * 2 >>
          (-(char)local_40 & 0x3fU),*(bool *)((long)in_RSI + 0xc));
    uVar6 = extraout_RDX_00;
  }
  else {
    uVar2 = *(undefined1 *)((long)in_RSI + 0xc);
    uVar9 = local_40 + 0x3f;
    uVar10 = uVar9 >> 6;
    local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this;
    pvVar5 = operator_new__((ulong)((uVar10 << (bVar1 & 0x1f)) << 3));
    this = (SVInt *)local_38;
    uVar6 = extraout_RDX;
    if (0x3f < uVar9) {
      uVar3 = *in_RSI;
      uVar6 = (ulong)uVar10;
      uVar7 = 0;
      uVar4 = uVar10;
      do {
        uVar4 = uVar4 - 1;
        uVar8 = *(ulong *)(uVar3 + (ulong)uVar4 * 8);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        uVar8 = (uVar8 & 0xf0f0f0f0f0f0f0f) << 4 | uVar8 >> 4 & 0xf0f0f0f0f0f0f0f;
        uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333) * 4;
        *(ulong *)((long)pvVar5 + uVar7 * 8) =
             (uVar8 >> 1 & 0x5555555555555555) + (uVar8 & 0x5555555555555555) * 2;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      if (((bVar1 & 1) != 0) && (0x3f < uVar9)) {
        uVar9 = uVar10 * 8;
        uVar7 = 0;
        do {
          uVar10 = uVar10 - 1;
          uVar8 = *(ulong *)(uVar3 + uVar9 + (ulong)uVar10 * 8);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          uVar8 = (uVar8 & 0xf0f0f0f0f0f0f0f) << 4 | uVar8 >> 4 & 0xf0f0f0f0f0f0f0f;
          uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333) * 4;
          *(ulong *)((long)pvVar5 + uVar7 * 8 + (ulong)uVar9) =
               (uVar8 >> 1 & 0x5555555555555555) + (uVar8 & 0x5555555555555555) * 2;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
    }
    local_3c = uVar2;
    local_3b = bVar1;
    if ((local_40 & 0x3f) == 0) {
      *(uint *)(local_38.val + 8) = local_40;
      *(undefined1 *)(local_38.val + 0xc) = uVar2;
      *(byte *)(local_38.val + 0xd) = bVar1;
      local_48 = (void *)0x0;
      *local_38.pVal = (uint64_t)pvVar5;
    }
    else {
      local_48 = pvVar5;
      SVar11 = lshr((SVInt *)local_38.pVal,(bitwidth_t)&local_48);
      uVar6 = SVar11.super_SVIntStorage._8_8_;
    }
    if (((0x40 < local_40) || ((local_3b & 1) != 0)) && (local_48 != (void *)0x0)) {
      operator_delete__(local_48);
      uVar6 = extraout_RDX_01;
    }
  }
  SVar11.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar11.super_SVIntStorage.signFlag = (bool)(char)(uVar6 >> 0x20);
  SVar11.super_SVIntStorage.unknownFlag = (bool)(char)(uVar6 >> 0x28);
  SVar11.super_SVIntStorage._14_2_ = (short)(uVar6 >> 0x30);
  SVar11.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar11.super_SVIntStorage;
}

Assistant:

SVInt SVInt::reverse() const {
    if (isSingleWord()) {
        uint64_t r = reverseBits64(val) >> (BITS_PER_WORD - bitWidth);
        return SVInt(bitWidth, r, signFlag);
    }

    auto result = SVInt::allocUninitialized(bitWidth, signFlag, unknownFlag);
    uint32_t words = getNumWords(bitWidth, false);
    uint64_t* dst = result.getRawData();
    const uint64_t* src = getRawData();

    for (uint32_t i = 0; i < words; i++)
        dst[i] = reverseBits64(src[words - i - 1]);

    if (unknownFlag) {
        dst += words;
        src += words;
        for (uint32_t i = 0; i < words; i++)
            dst[i] = reverseBits64(src[words - i - 1]);
    }

    // If we aren't aligned to a multiple of 64 bits, we need to shift
    // the result back down because we reversed some bits that weren't
    // actually included in the number.
    bitwidth_t msw = bitWidth % BITS_PER_WORD;
    if (msw != 0)
        return result.lshr(BITS_PER_WORD - msw);

    return result;
}